

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proitems.h
# Opt level: O3

void __thiscall
ProString::ProString<ProString,char_const(&)[14]>
          (ProString *this,QStringBuilder<ProString,_const_char_(&)[14]> *str)

{
  long in_FS_OFFSET;
  QString local_30;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  QStringBuilder<ProString,_const_char_(&)[14]>::convertTo<QString>(&local_30,str);
  ProString(this,&local_30);
  if (&(local_30.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_30.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_30.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_30.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_30.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

ProString(const QStringBuilder<A, B> &str)
        : ProString(QString(str))
    {}